

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_decomp.h
# Opt level: O1

bool __thiscall crnd::crn_unpacker::decode_color_selectors(crn_unpacker *this)

{
  vector<unsigned_int> *this_00;
  ushort uVar1;
  crn_header *pcVar2;
  bool bVar3;
  byte bVar4;
  byte bVar5;
  uint32 uVar6;
  uint8 *puVar7;
  uint uVar8;
  byte bVar9;
  ulong uVar10;
  uint uVar11;
  int iVar12;
  uint uVar13;
  byte bVar14;
  uint uVar15;
  byte bVar16;
  int iVar17;
  uint uVar18;
  byte bVar19;
  static_huffman_data_model dm;
  static_huffman_data_model local_58;
  
  pcVar2 = this->m_pHeader;
  bVar4 = (pcVar2->m_format).m_buf[0];
  uVar8 = (uint)(pcVar2->m_color_selectors).m_size.m_buf[2] |
          (uint)(pcVar2->m_color_selectors).m_size.m_buf[1] << 8 |
          (uint)(pcVar2->m_color_selectors).m_size.m_buf[0] << 0x10;
  if (uVar8 != 0) {
    puVar7 = this->m_pData +
             ((ulong)(pcVar2->m_color_selectors).m_ofs.m_buf[2] |
             (ulong)((uint)(pcVar2->m_color_selectors).m_ofs.m_buf[0] << 0x10 |
                    (uint)(pcVar2->m_color_selectors).m_ofs.m_buf[1] << 8));
    (this->m_codec).m_pDecode_buf = puVar7;
    (this->m_codec).m_pDecode_buf_next = puVar7;
    (this->m_codec).m_decode_buf_size = uVar8;
    (this->m_codec).m_pDecode_buf_end = puVar7 + uVar8;
    (this->m_codec).m_bit_buf = 0;
    (this->m_codec).m_bit_count = 0;
  }
  local_58.m_total_syms = 0;
  local_58.m_code_sizes.m_p = (uchar *)0x0;
  local_58.m_code_sizes.m_size = 0;
  local_58.m_code_sizes.m_capacity = 0;
  local_58.m_code_sizes.m_alloc_failed = false;
  local_58.m_pDecode_tables = (decoder_tables *)0x0;
  symbol_codec::decode_receive_static_data_model(&this->m_codec,&local_58);
  uVar18 = bVar4 - 10;
  uVar1 = *(ushort *)(this->m_pHeader->m_color_selectors).m_num.m_buf;
  uVar11 = (uint)(ushort)(uVar1 << 8 | uVar1 >> 8) << (uVar18 < 3);
  this_00 = &this->m_color_selectors;
  uVar8 = (this->m_color_selectors).m_size;
  if (uVar8 != uVar11) {
    if (uVar8 <= uVar11) {
      if (((this->m_color_selectors).m_capacity < uVar11) &&
         (bVar3 = elemental_vector::increase_capacity
                            ((elemental_vector *)this_00,uVar11,uVar8 + 1 == uVar11,4,
                             (object_mover)0x0), !bVar3)) {
        (this->m_color_selectors).m_alloc_failed = true;
        goto LAB_001135be;
      }
      uVar8 = (this->m_color_selectors).m_size;
      memset((this->m_color_selectors).m_p + uVar8,0,(ulong)(uVar11 - uVar8) << 2);
    }
    (this->m_color_selectors).m_size = uVar11;
  }
LAB_001135be:
  uVar1 = *(ushort *)(this->m_pHeader->m_color_selectors).m_num.m_buf;
  if ((uVar1 & 0xff) != 0 || uVar1 >> 8 != 0) {
    uVar10 = 0;
    uVar8 = 0;
    do {
      uVar11 = 0xfffffffc;
      do {
        uVar11 = uVar11 + 4;
        uVar6 = symbol_codec::decode(&this->m_codec,&local_58);
        uVar8 = uVar8 ^ uVar6 << ((byte)uVar11 & 0x1f);
      } while (uVar11 < 0x1c);
      if (uVar18 < 5) {
        uVar15 = ~(uVar8 >> 1 & 0x55555555 ^ uVar8);
        uVar11 = (uint)uVar10 * 2 + 1;
        if (2 < uVar18) {
          uVar11 = (uint)uVar10;
        }
        bVar19 = 8;
        bVar4 = 0;
        bVar16 = 0;
        iVar17 = 0;
        do {
          iVar12 = 0;
          bVar14 = bVar19;
          bVar5 = bVar4;
          bVar9 = bVar16;
          do {
            if (uVar18 < 3) {
              uVar13 = uVar15 >> (bVar5 & 0x1f);
              this_00->m_p[uVar10 * 2] =
                   this_00->m_p[uVar10 * 2] |
                   ((uVar13 & 1) << 0x10 | uVar13 >> 1 & 1) << (bVar14 & 0xf);
            }
            uVar13 = uVar15 >> (bVar9 & 0x1f);
            this_00->m_p[uVar11] =
                 this_00->m_p[uVar11] | ((uVar13 & 1) << 0x10 | uVar13 >> 1 & 1) << (bVar14 & 0xf);
            bVar14 = bVar14 + 4;
            iVar12 = iVar12 + -4;
            bVar9 = bVar9 + 2;
            bVar5 = bVar5 + 8;
          } while (iVar12 != -0x10);
          iVar17 = iVar17 + 1;
          bVar19 = bVar19 + 1;
          bVar16 = bVar16 + 8;
          bVar4 = bVar4 + 2;
        } while (iVar17 != 4);
      }
      else {
        this_00->m_p[uVar10] = uVar8 >> 1 & 0x55555555 | (uVar8 * 2 ^ uVar8) & 0xaaaaaaaa;
      }
      uVar10 = uVar10 + 1;
      uVar1 = *(ushort *)(this->m_pHeader->m_color_selectors).m_num.m_buf;
    } while (uVar10 < (ushort)(uVar1 << 8 | uVar1 >> 8));
  }
  static_huffman_data_model::~static_huffman_data_model(&local_58);
  return true;
}

Assistant:

bool decode_color_selectors() {
    const bool has_etc_color_blocks = m_pHeader->m_format == cCRNFmtETC1 || m_pHeader->m_format == cCRNFmtETC2 || m_pHeader->m_format == cCRNFmtETC2A || m_pHeader->m_format == cCRNFmtETC1S || m_pHeader->m_format == cCRNFmtETC2AS;
    const bool has_subblocks = m_pHeader->m_format == cCRNFmtETC1 || m_pHeader->m_format == cCRNFmtETC2 || m_pHeader->m_format == cCRNFmtETC2A;
    m_codec.start_decoding(m_pData + m_pHeader->m_color_selectors.m_ofs, m_pHeader->m_color_selectors.m_size);
    static_huffman_data_model dm;
    m_codec.decode_receive_static_data_model(dm);
    m_color_selectors.resize(m_pHeader->m_color_selectors.m_num << (has_subblocks ? 1 : 0));
    for (uint32 s = 0, i = 0; i < m_pHeader->m_color_selectors.m_num; i++) {
      for (uint32 j = 0; j < 32; j += 4)
        s ^= m_codec.decode(dm) << j;
      if (has_etc_color_blocks) {
        for (uint32 selector = (~s & 0xAAAAAAAA) | (~(s ^ s >> 1) & 0x55555555), t = 8, h = 0; h < 4; h++, t -= 15) {
          for (uint32 w = 0; w < 4; w++, t += 4) {
            if (has_subblocks) {
              uint32 s0 = selector >> (w << 3 | h << 1);
              m_color_selectors[i << 1] |= ((s0 >> 1 & 1) | (s0 & 1) << 16) << (t & 15);
            }
            uint32 s1 = selector >> (h << 3 | w << 1);
            m_color_selectors[has_subblocks ? i << 1 | 1 : i] |= ((s1 >> 1 & 1) | (s1 & 1) << 16) << (t & 15);
          }
        }
      } else {
        m_color_selectors[i] = ((s ^ s << 1) & 0xAAAAAAAA) | (s >> 1 & 0x55555555);
      }
    }
    m_codec.stop_decoding();
    return true;
  }